

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

int __thiscall ThreadTask::init(ThreadTask *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  anon_class_8_1_8991fb9c_for__M_head_impl local_20;
  thread local_18;
  
  local_20.this = this;
  std::thread::thread<ThreadTask::init()::_lambda()_1_,,void>(&local_18,&local_20);
  std::thread::operator=(&this->_thread,&local_18);
  std::thread::~thread(&local_18);
  return extraout_EAX;
}

Assistant:

void init()
	{
		_thread = std::thread(
			[this]()
		{
			while (true)
			{
				std::unique_lock<std::mutex> lock(this->_queueMutex);
				this->_condition.wait(lock,
					[this] { return !this->_taskQueue.empty(); });
				auto task = this->_taskQueue.front();
				this->_taskQueue.pop();
				task.task();
				if (task.callback != nullptr)
					task.callback();
			}
		}
		);
	}